

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp-mpiu.c
# Opt level: O0

int MPI_Alltoallv_sparse
              (void *sendbuf,int *sendcnts,int *sdispls,MPI_Datatype sendtype,void *recvbuf,
              int *recvcnts,int *rdispls,MPI_Datatype recvtype,MPI_Comm comm)

{
  uint uVar1;
  void *__ptr;
  int target_1;
  int target;
  MPI_Request *requests;
  long lStack_60;
  int n_requests;
  ptrdiff_t recv_elsize;
  ptrdiff_t send_elsize;
  ptrdiff_t lb;
  int ngrp;
  int PTask;
  int NTask;
  int ThisTask;
  int *recvcnts_local;
  void *recvbuf_local;
  MPI_Datatype sendtype_local;
  int *sdispls_local;
  int *sendcnts_local;
  void *sendbuf_local;
  
  _NTask = recvcnts;
  recvcnts_local = (int *)recvbuf;
  recvbuf_local = sendtype;
  sendtype_local = (MPI_Datatype)sdispls;
  sdispls_local = sendcnts;
  sendcnts_local = (int *)sendbuf;
  MPI_Comm_rank(comm,&PTask);
  MPI_Comm_size(comm,&ngrp);
  for (lb._4_4_ = 0; 1 << ((byte)lb._4_4_ & 0x1f) < ngrp; lb._4_4_ = lb._4_4_ + 1) {
  }
  MPI_Type_get_extent(recvbuf_local,&send_elsize,&recv_elsize);
  MPI_Type_get_extent(recvtype,&send_elsize,&stack0xffffffffffffffa0);
  __ptr = malloc((long)(ngrp << 1) << 3);
  requests._4_4_ = 0;
  for (lb._0_4_ = 0; (int)(uint)lb < 1 << ((byte)lb._4_4_ & 0x1f); lb._0_4_ = (uint)lb + 1) {
    uVar1 = PTask ^ (uint)lb;
    if (((int)uVar1 < ngrp) && (_NTask[(int)uVar1] != 0)) {
      MPI_Irecv((int *)((long)recvcnts_local + lStack_60 * rdispls[(int)uVar1]),_NTask[(int)uVar1],
                recvtype,uVar1,0x18e2e,comm,(void *)((long)__ptr + (long)requests._4_4_ * 8));
      requests._4_4_ = requests._4_4_ + 1;
    }
  }
  MPI_Barrier(comm);
  for (lb._0_4_ = 0; (int)(uint)lb < 1 << ((byte)lb._4_4_ & 0x1f); lb._0_4_ = (uint)lb + 1) {
    uVar1 = PTask ^ (uint)lb;
    if (((int)uVar1 < ngrp) && (sdispls_local[(int)uVar1] != 0)) {
      MPI_Isend((int *)((long)sendcnts_local +
                       recv_elsize * *(int *)(sendtype_local + (long)(int)uVar1 * 4)),
                sdispls_local[(int)uVar1],recvbuf_local,uVar1,0x18e2e,comm,
                (void *)((long)__ptr + (long)requests._4_4_ * 8));
      requests._4_4_ = requests._4_4_ + 1;
    }
  }
  MPI_Waitall(requests._4_4_,__ptr,0);
  free(__ptr);
  MPI_Barrier(comm);
  return 0;
}

Assistant:

static int MPI_Alltoallv_sparse(void *sendbuf, int *sendcnts, int *sdispls,
        MPI_Datatype sendtype, void *recvbuf, int *recvcnts,
        int *rdispls, MPI_Datatype recvtype, MPI_Comm comm) {

    int ThisTask;
    int NTask;
    MPI_Comm_rank(comm, &ThisTask);
    MPI_Comm_size(comm, &NTask);
    int PTask;
    int ngrp;

    for(PTask = 0; NTask > (1 << PTask); PTask++);

    ptrdiff_t lb;
    ptrdiff_t send_elsize;
    ptrdiff_t recv_elsize;

    MPI_Type_get_extent(sendtype, &lb, &send_elsize);
    MPI_Type_get_extent(recvtype, &lb, &recv_elsize);

#ifndef NO_ISEND_IRECV_IN_DOMAIN
    int n_requests;
    MPI_Request *requests = malloc(NTask * 2 * sizeof(MPI_Request));
    n_requests = 0;


    for(ngrp = 0; ngrp < (1 << PTask); ngrp++)
    {
        int target = ThisTask ^ ngrp;

        if(target >= NTask) continue;
        if(recvcnts[target] == 0) continue;
        MPI_Irecv(
                ((char*) recvbuf) + recv_elsize * rdispls[target],
                recvcnts[target],
                recvtype, target, 101934, comm, &requests[n_requests++]);
    }

    MPI_Barrier(comm);
    /* not really necessary, but this will guarantee that all receives are
       posted before the sends, which helps the stability of MPI on
       bluegene, and perhaps some mpich1-clusters */
    /* Note 08/2016: Even on modern hardware this barrier leads to a slight speedup.
     * Probably because it allows the code to hit a fast path transfer.*/

    for(ngrp = 0; ngrp < (1 << PTask); ngrp++)
    {
        int target = ThisTask ^ ngrp;
        if(target >= NTask) continue;
        if(sendcnts[target] == 0) continue;
        MPI_Isend(((char*) sendbuf) + send_elsize * sdispls[target],
                sendcnts[target],
                sendtype, target, 101934, comm, &requests[n_requests++]);
    }

    MPI_Waitall(n_requests, requests, MPI_STATUSES_IGNORE);
    free(requests);
#else
    for(ngrp = 0; ngrp < (1 << PTask); ngrp++)
    {
        int target = ThisTask ^ ngrp;

        if(target >= NTask) continue;
        if(sendcnts[target] == 0 && recvcnts[target] == 0) continue;
        MPI_Sendrecv(((char*)sendbuf) + send_elsize * sdispls[target],
                sendcnts[target], sendtype,
                target, 101934,
                ((char*)recvbuf) + recv_elsize * rdispls[target],
                recvcnts[target], recvtype,
                target, 101934,
                comm, MPI_STATUS_IGNORE);

    }
#endif
    /* ensure the collective-ness */
    MPI_Barrier(comm);

    return 0;
}